

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resample_filters.cpp
# Opt level: O2

float crnlib::blackman_filter(float t)

{
  double dVar1;
  double dVar2;
  double dVar3;
  float fVar4;
  float fVar5;
  
  fVar5 = -t;
  if (-t <= t) {
    fVar5 = t;
  }
  fVar4 = 0.0;
  if (fVar5 < 3.0) {
    dVar1 = sinc((double)fVar5);
    dVar2 = cos((double)(fVar5 / 3.0) * 3.141592653589793);
    dVar3 = cos((double)(fVar5 / 3.0) * 6.283185307179586);
    dVar1 = (dVar3 * 0.07684867084026337 + dVar2 * 0.49656063318252563 + 0.4265907108783722) * dVar1
    ;
    fVar4 = 0.0;
    if (1.249999968422344e-05 <= ABS(dVar1)) {
      fVar4 = (float)dVar1;
    }
  }
  return fVar4;
}

Assistant:

static float blackman_filter(float t)
    {
        if (t < 0.0f)
        {
            t = -t;
        }

        if (t < 3.0f)
        {
            //return clean(sinc(t) * blackman_window(t / 3.0f));
            return clean(sinc(t) * blackman_exact_window(t / 3.0f));
        }
        else
        {
            return 0.0f;
        }
    }